

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O3

uint16_t __thiscall cppnet::TimerContainer::TimeUnit2TimeType(TimerContainer *this,TIME_UNIT tu)

{
  undefined8 *puVar1;
  
  if (tu == TU_MILLISECOND) {
    return 0x400;
  }
  if (tu != TU_MINUTE) {
    if (tu == TU_SECOND) {
      return 0x800;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "invalid time unit";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  return 0x1000;
}

Assistant:

uint16_t TimerContainer::TimeUnit2TimeType(TIME_UNIT tu) {
    switch (tu)
    {
    case TU_MILLISECOND:
        return TIT_MILLISECOND;
    case TU_SECOND:
        return TIT_SECOND;
    case TU_MINUTE:
        return TIT_MINUTE;
    default:
        throw "invalid time unit";
    }
}